

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O2

uint64_t __thiscall
cppnet::CppNetBase::AddTimer
          (CppNetBase *this,uint32_t interval,user_timer_call_back *cb,void *param,bool always)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = RangeRandom::Random((this->_random)._M_t.
                              super___uniq_ptr_impl<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cppnet::RangeRandom_*,_std::default_delete<cppnet::RangeRandom>_>
                              .super__Head_base<0UL,_cppnet::RangeRandom_*,_false>._M_head_impl);
  uVar2 = Dispatcher::AddTimer
                    ((this->_dispatchers).
                     super__Vector_base<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar1].
                     super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr,cb,
                     param,interval,always);
  return CONCAT44(uVar1,uVar2);
}

Assistant:

uint64_t CppNetBase::AddTimer(uint32_t interval, user_timer_call_back&& cb, void* param, bool always) {
    uint32_t index = _random->Random();
    uint32_t id = _dispatchers[index]->AddTimer(cb, param, interval, always);
    TimerId tid;
    tid._detail_info._dispatcher_index = index;
    tid._detail_info._timer_id = id;
    return tid._timer_id;
}